

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::remove_mblur(Ref<embree::SceneGraph::Node> *node,bool mblur)

{
  long *plVar1;
  Node *pNVar2;
  bool bVar3;
  byte bVar4;
  long *plVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  size_t sVar9;
  byte in_DL;
  long *in_RSI;
  Node *in_RDI;
  Ref<embree::SceneGraph::PointSetNode> mesh_4;
  Ref<embree::SceneGraph::HairSetNode> mesh_3;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_2;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  long *local_728;
  long *local_6f0;
  long *local_6b8;
  long *local_680;
  long *local_648;
  long *local_5d8;
  long *local_540;
  long *local_4b8;
  Node *local_460;
  ulong local_458;
  long local_440;
  long local_428;
  undefined7 in_stack_fffffffffffffbf8;
  
  bVar4 = in_DL & 1;
  if (*in_RSI == 0) {
    local_4b8 = (long *)0x0;
  }
  else {
    local_4b8 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_4b8 != (long *)0x0) {
    (**(code **)(*local_4b8 + 0x10))();
  }
  if (local_4b8 == (long *)0x0) {
    if (*in_RSI == 0) {
      local_540 = (long *)0x0;
    }
    else {
      local_540 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    if (local_540 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_5d8 = (long *)0x0;
      }
      else {
        local_5d8 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      if (local_5d8 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_648 = (long *)0x0;
        }
        else {
          local_648 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
        }
        if (local_648 == (long *)0x0) {
          if (*in_RSI == 0) {
            local_680 = (long *)0x0;
          }
          else {
            local_680 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
          }
          if (local_680 == (long *)0x0) {
            if (*in_RSI == 0) {
              local_6b8 = (long *)0x0;
            }
            else {
              local_6b8 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&SubdivMeshNode::typeinfo,0
                                                );
            }
            if (local_6b8 == (long *)0x0) {
              if (*in_RSI == 0) {
                local_6f0 = (long *)0x0;
              }
              else {
                local_6f0 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&HairSetNode::typeinfo,0)
                ;
              }
              if (local_6f0 == (long *)0x0) {
                if (*in_RSI == 0) {
                  local_728 = (long *)0x0;
                }
                else {
                  local_728 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&PointSetNode::typeinfo
                                                     ,0);
                }
                if (local_728 == (long *)0x0) {
LAB_00238cdb:
                  bVar3 = false;
                }
                else {
                  (**(code **)(*local_728 + 0x10))();
                  sVar9 = PointSetNode::numTimeSteps((PointSetNode *)0x238be3);
                  if (1 < sVar9 != (bool)(bVar4 & 1)) goto LAB_00238cdb;
                  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
                  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
                    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
                  }
                  bVar3 = true;
                }
                if (local_728 != (long *)0x0) {
                  (**(code **)(*local_728 + 0x18))();
                }
                if (!bVar3) {
LAB_00238d35:
                  bVar3 = false;
                }
              }
              else {
                (**(code **)(*local_6f0 + 0x10))();
                sVar9 = HairSetNode::numTimeSteps((HairSetNode *)0x2389fa);
                if (1 < sVar9 != (bool)(bVar4 & 1)) goto LAB_00238d35;
                (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
                if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
                  (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
                }
                bVar3 = true;
              }
              if (local_6f0 != (long *)0x0) {
                (**(code **)(*local_6f0 + 0x18))();
              }
              if (!bVar3) {
LAB_00238dd1:
                bVar3 = false;
              }
            }
            else {
              (**(code **)(*local_6b8 + 0x10))();
              sVar9 = SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x238811);
              if (1 < sVar9 != (bool)(bVar4 & 1)) goto LAB_00238dd1;
              (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
              if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
                (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
              }
              bVar3 = true;
            }
            if (local_6b8 != (long *)0x0) {
              (**(code **)(*local_6b8 + 0x18))();
            }
            if (!bVar3) {
LAB_00238e6d:
              bVar3 = false;
            }
          }
          else {
            (**(code **)(*local_680 + 0x10))();
            sVar9 = QuadMeshNode::numTimeSteps((QuadMeshNode *)0x238628);
            if (1 < sVar9 != (bool)(bVar4 & 1)) goto LAB_00238e6d;
            (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
            if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
              (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
            }
            bVar3 = true;
          }
          if (local_680 != (long *)0x0) {
            (**(code **)(*local_680 + 0x18))();
          }
          if (!bVar3) {
LAB_00238f09:
            bVar3 = false;
          }
        }
        else {
          (**(code **)(*local_648 + 0x10))();
          sVar9 = TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x23843f);
          if (1 < sVar9 != (bool)(bVar4 & 1)) goto LAB_00238f09;
          (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          bVar3 = true;
        }
        if (local_648 != (long *)0x0) {
          (**(code **)(*local_648 + 0x18))();
        }
        if (!bVar3) goto LAB_00238fa5;
      }
      else {
        (**(code **)(*local_5d8 + 0x10))();
        for (local_458 = 0;
            sVar7 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_5d8 + 0xd)), local_458 < sVar7; local_458 = local_458 + 1) {
          pvVar8 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_5d8 + 0xd),local_458);
          pNVar2 = pvVar8->ptr;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[2])();
          }
          remove_mblur((Ref<embree::SceneGraph::Node> *)CONCAT17(bVar4,in_stack_fffffffffffffbf8),
                       SUB81((ulong)local_4b8 >> 0x38,0));
          pvVar8 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_5d8 + 0xd),local_458);
          if (pvVar8->ptr != (Node *)0x0) {
            (*(pvVar8->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar8->ptr = local_460;
          local_460 = (Node *)0x0;
          if (pNVar2 != (Node *)0x0) {
            (*(pNVar2->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_00238fa5:
        bVar3 = false;
      }
      if (local_5d8 != (long *)0x0) {
        (**(code **)(*local_5d8 + 0x18))();
      }
      if (!bVar3) {
LAB_00239041:
        bVar3 = false;
      }
    }
    else {
      (**(code **)(*local_540 + 0x10))();
      if ((bVar4 & 1) == 0) {
        sVar7 = std::
                vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)(local_540 + 0xd));
        if ((sVar7 == 0) ||
           (pvVar6 = std::
                     vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                     ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                   *)(local_540 + 0xd),0), (pvVar6->spaces).size_active < 2))
        goto LAB_00237c39;
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
        *in_RSI = 0;
        bVar3 = true;
      }
      else {
        sVar7 = std::
                vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ::size((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                        *)(local_540 + 0xd));
        if ((sVar7 != 0) &&
           (pvVar6 = std::
                     vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                     ::operator[]((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                   *)(local_540 + 0xd),0), (pvVar6->spaces).size_active < 2)) {
LAB_00237c39:
          plVar1 = (long *)local_540[0x10];
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x10))();
          }
          remove_mblur((Ref<embree::SceneGraph::Node> *)CONCAT17(bVar4,in_stack_fffffffffffffbf8),
                       SUB81((ulong)local_4b8 >> 0x38,0));
          plVar5 = local_540 + 0x10;
          if (*plVar5 != 0) {
            (**(code **)(*(long *)*plVar5 + 0x18))();
          }
          *plVar5 = local_440;
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x18))();
          }
          goto LAB_00239041;
        }
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        bVar3 = true;
      }
    }
    if (local_540 != (long *)0x0) {
      (**(code **)(*local_540 + 0x18))();
    }
    if (bVar3) goto LAB_002390eb;
  }
  else {
    if ((bVar4 & 1) == 0) {
      if (1 < (ulong)local_4b8[0xf]) {
        (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
        *in_RSI = 0;
        bVar3 = true;
        goto LAB_002390eb;
      }
    }
    else if (1 < (ulong)local_4b8[0xf]) {
      (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
      if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
        (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
      }
      bVar3 = true;
      goto LAB_002390eb;
    }
    plVar1 = (long *)local_4b8[0x13];
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x10))();
    }
    remove_mblur((Ref<embree::SceneGraph::Node> *)CONCAT17(bVar4,in_stack_fffffffffffffbf8),
                 SUB81((ulong)local_4b8 >> 0x38,0));
    plVar5 = local_4b8 + 0x13;
    if (*plVar5 != 0) {
      (**(code **)(*(long *)*plVar5 + 0x18))();
    }
    *plVar5 = local_428;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x18))();
    }
  }
  bVar3 = false;
LAB_002390eb:
  if (local_4b8 != (long *)0x0) {
    (**(code **)(*local_4b8 + 0x18))();
  }
  if (!bVar3) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::remove_mblur(Ref<SceneGraph::Node> node, bool mblur)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      if (mblur) {
        if (xfmNode->spaces.size() == 0 || xfmNode->spaces[0].size() > 1)
          return nullptr;
      } else {
        if (xfmNode->spaces.size() > 0 && xfmNode->spaces[0].size() > 1)
          return node;
      }
      xfmNode->child = remove_mblur(xfmNode->child, mblur);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>())
    {
      for (size_t i=0; i<groupNode->children.size(); i++)
        groupNode->children[i] = remove_mblur(groupNode->children[i], mblur);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      if ((mesh->numTimeSteps() > 1) == mblur)
        return nullptr;
    }
    return node;
  }